

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void raviX_ptrlist_sort(PtrList **plist,void *userdata,_func_int_void_ptr_void_ptr_void_ptr *cmp)

{
  PtrList **ppPVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void **ppvVar7;
  long lVar8;
  void **ppvVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  PtrList *pPVar13;
  PtrList *pPVar14;
  PtrList *b;
  PtrList *pPVar15;
  PtrList *pPVar16;
  PtrList *b_00;
  uint uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  void *buffer [14];
  uint local_110;
  uint local_10c;
  PtrList *local_108;
  PtrList *local_100;
  uint local_f8;
  uint local_f4;
  void *local_f0;
  _func_int_void_ptr_void_ptr_void_ptr *local_e8;
  PtrList *local_e0;
  PtrList *local_d8;
  void **local_d0;
  void **local_c8;
  PtrList **local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8 [15];
  
  pPVar14 = *plist;
  pPVar13 = pPVar14;
  local_f0 = userdata;
  local_e8 = cmp;
  local_c0 = plist;
  if (pPVar14 == (PtrList *)0x0) {
    return;
  }
  do {
    if (1 < *(char *)pPVar13) {
      local_108 = (PtrList *)(ulong)(ushort)(short)*(char *)pPVar13;
      lVar18 = 1;
      lVar12 = 0;
      do {
        pvVar2 = pPVar13->list_[lVar18];
        iVar5 = (*local_e8)(local_f0,pPVar13->list_[lVar18 + -1],pvVar2);
        lVar3 = lVar12;
        if (0 < iVar5) {
          do {
            lVar8 = lVar3;
            *(undefined8 *)((long)pPVar13->list_ + lVar8 + 8) =
                 *(undefined8 *)((long)pPVar13->list_ + lVar8);
            if (lVar8 == 0) break;
            iVar5 = (*local_e8)(local_f0,*(void **)((long)pPVar13->list_ + lVar8 + -8),pvVar2);
            lVar3 = lVar8 + -8;
          } while (0 < iVar5);
          *(void **)((long)pPVar13->list_ + lVar8) = pvVar2;
        }
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 8;
      } while ((PtrList *)lVar18 != local_108);
    }
    verify_sorted(pPVar13,1,local_f0,local_e8);
    ppPVar1 = &pPVar13->next_;
    pPVar13 = *ppPVar1;
  } while (*ppPVar1 != pPVar14);
  uVar17 = 1;
LAB_0010bef8:
  uVar11 = ~((int)uVar17 >> 0x1f) & uVar17;
  pPVar13 = pPVar14;
  local_10c = uVar11;
  local_f8 = uVar17;
LAB_0010bf0c:
  b_00 = pPVar13;
  uVar6 = uVar17;
  if (0 < (int)uVar17) {
    do {
      b_00 = b_00->next_;
      if (b_00 == pPVar14) {
        if (pPVar13 == pPVar14) {
          *local_c0 = pPVar14;
          return;
        }
        goto LAB_0010c231;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar6 = 0;
  pPVar15 = b_00;
  do {
    uVar10 = uVar11;
    if (uVar11 == uVar6) break;
    pPVar15 = pPVar15->next_;
    uVar6 = uVar6 + 1;
    uVar10 = uVar6;
  } while (pPVar15 != pPVar14);
  local_110 = 0;
  uVar6 = uVar10;
  do {
    b = pPVar13;
    local_100 = pPVar13;
    if (*(char *)b_00 != '\0') goto LAB_0010bf6e;
    b_00 = b_00->next_;
    uVar6 = uVar6 - 1;
    pPVar16 = pPVar13;
    uVar4 = uVar17;
    uVar11 = local_10c;
  } while (uVar6 != 0);
  goto LAB_0010bfb8;
  while( true ) {
    uVar17 = uVar17 - 1;
    pPVar13 = local_100;
    pPVar14 = local_d8;
    b = b->next_;
    pPVar16 = local_100;
    uVar4 = local_f8;
    uVar11 = local_10c;
    if (uVar17 == 0) break;
LAB_0010bf6e:
    local_d8 = pPVar14;
    if (((short)(*(int *)b << 8) != 0) &&
       (iVar5 = (*local_e8)(local_f0,b->list_[(long)(short)(char)*(int *)b + -1],b_00->list_[0]),
       -1 < iVar5)) {
      ppvVar7 = b->list_;
      local_e0 = local_100;
      uVar11 = 0;
      local_d0 = ppvVar7;
      goto LAB_0010bffa;
    }
  }
LAB_0010bfb8:
  uVar17 = uVar4;
  verify_sorted(pPVar13,uVar10 + uVar17,local_f0,local_e8);
  if (pPVar16 == pPVar14) {
    pPVar14 = pPVar13;
  }
  pPVar13 = pPVar15;
  if (pPVar15 == pPVar14) goto LAB_0010c231;
  goto LAB_0010bf0c;
LAB_0010bffa:
  ppvVar9 = b_00->list_;
  iVar5 = 0;
  local_c8 = ppvVar9;
LAB_0010c005:
  if ((int)*(char *)b <= (int)uVar11) goto LAB_0010c275;
  if ((iVar5 < 0) || (*(char *)b_00 <= iVar5)) {
    __assert_fail("i2 >= 0 && i2 < b2->nr_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x201,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if (b == b_00) {
    __assert_fail("b1 != b2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x202,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if ((int)uVar17 < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x203,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  local_108 = (PtrList *)CONCAT44(local_108._4_4_,iVar5);
  local_f4 = uVar11;
  if ((int)uVar6 < 1) {
    __assert_fail("m > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x204,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  local_b8 = *ppvVar7;
  local_b0 = *ppvVar9;
  iVar5 = (*local_e8)(local_f0,local_b8,local_b0);
  lVar12 = (long)(int)local_110;
  local_110 = local_110 + 1;
  if (iVar5 < 1) {
    local_a8[lVar12] = local_b8;
    uVar11 = local_f4 + 1;
    iVar5 = (uint)local_108;
    if ((int)*(char *)b <= (int)uVar11) {
      flush_to(b,local_a8,(int *)&local_110);
LAB_0010c0c4:
      b = b->next_;
      if (uVar17 != 1) goto code_r0x0010c0d3;
      for (; b != b_00; b = b->next_) {
        flush_to(b,local_a8,(int *)&local_110);
      }
      if (local_110 != (uint)local_108) {
        __assert_fail("nbuf == i2",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                      ,0x216,
                      "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                     );
      }
      uVar17 = (uint)*(char *)b_00;
      bVar20 = SBORROW4((uint)local_108,uVar17);
      iVar5 = (uint)local_108 - uVar17;
      bVar19 = (uint)local_108 == uVar17;
      uVar17 = (uint)local_108;
      goto LAB_0010c1d3;
    }
    goto LAB_0010c0df;
  }
  local_a8[lVar12] = local_b0;
  uVar11 = local_f4;
  iVar5 = (uint)local_108 + 1;
  if ((int)*(char *)b_00 <= (int)((uint)local_108 + 1)) goto LAB_0010c109;
  goto LAB_0010c0df;
LAB_0010c109:
  local_108 = b_00->next_;
  pPVar14 = b_00->prev_;
  local_108->prev_ = pPVar14;
  pPVar14->next_ = local_108;
  b_00->next_ = b;
  b_00->prev_ = b->prev_;
  b->prev_ = b_00;
  if (b == local_e0) {
    local_e0 = b_00;
  }
  b_00->prev_->next_ = b_00;
  flush_to(b_00,local_a8,(int *)&local_110);
  b_00 = local_108->prev_;
LAB_0010c168:
  uVar6 = uVar6 - 1;
  if (uVar6 != 0) goto code_r0x0010c170;
  if (local_110 != local_f4) {
    __assert_fail("nbuf == i1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x23a,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  local_c8 = local_d0;
  bVar20 = SBORROW4(local_f4,(int)*(char *)b);
  iVar5 = local_f4 - (int)*(char *)b;
  bVar19 = iVar5 == 0;
  uVar17 = local_f4;
LAB_0010c1d3:
  pPVar14 = local_d8;
  uVar4 = local_f8;
  pPVar16 = local_100;
  uVar11 = local_10c;
  if (!bVar19 && bVar20 == iVar5 < 0) {
    __assert_fail("nbuf <= b->nr_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x1d4,"void dump_to(PtrList *, void **, int)");
  }
  memcpy(local_c8,local_a8,(ulong)uVar17 << 3);
  pPVar13 = local_e0;
  goto LAB_0010bfb8;
code_r0x0010c170:
  b_00 = b_00->next_;
  if (*(char *)b_00 != '\0') goto code_r0x0010c17a;
  goto LAB_0010c168;
code_r0x0010c17a:
  local_d0 = b->list_;
  ppvVar7 = b->list_ + local_f4;
  uVar11 = local_f4;
  if ((int)local_f4 < 0) {
LAB_0010c275:
    __assert_fail("i1 >= 0 && i1 < b1->nr_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x200,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  goto LAB_0010bffa;
code_r0x0010c0d3:
  uVar17 = uVar17 - 1;
  if (*(char *)b != '\0') goto code_r0x0010c0dd;
  goto LAB_0010c0c4;
code_r0x0010c0dd:
  uVar11 = 0;
  iVar5 = (uint)local_108;
LAB_0010c0df:
  local_d0 = b->list_;
  ppvVar7 = b->list_ + uVar11;
  ppvVar9 = local_c8 + iVar5;
  if ((int)uVar11 < 0) goto LAB_0010c275;
  goto LAB_0010c005;
LAB_0010c231:
  uVar17 = uVar17 * 2;
  goto LAB_0010bef8;
}

Assistant:

void raviX_ptrlist_sort(PtrList **plist, void *userdata, int (*cmp)(void *, const void *, const void *))
{
	PtrList *head = *plist, *list = head;
	int blocks = 1;

	assert(N_ == LIST_NODE_NR);
	if (!head)
		return;

	// Sort all the sub-lists
	do {
		array_sort(list->list_, list->nr_, userdata, cmp);
#ifdef PARANOIA
		verify_sorted(list, 1, userdata, cmp);
#endif
		list = list->next_;
	} while (list != head);

	// Merge the damn things together
	while (1) {
		PtrList *block1 = head;

		do {
			PtrList *block2 = block1;
			PtrList *next, *newhead;
			int i;

			for (i = 0; i < blocks; i++) {
				block2 = block2->next_;
				if (block2 == head) {
					if (block1 == head) {
						// BEEN_THERE('A');
						*plist = head;
						return;
					}
					// BEEN_THERE('B');
					goto next_pass;
				}
			}

			next = block2;
			for (i = 0; i < blocks;) {
				next = next->next_;
				i++;
				if (next == head) {
					// BEEN_THERE('C');
					break;
				}
				// BEEN_THERE('D');
			}

			newhead = merge_block_seqs(block1, blocks, block2, i, userdata, cmp);
#ifdef PARANOIA
			verify_sorted(newhead, blocks + i, userdata, cmp);
#endif
			if (block1 == head) {
				// BEEN_THERE('E');
				head = newhead;
			}
			block1 = next;
		} while (block1 != head);
	next_pass:
		blocks <<= 1;
	}
}